

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void execute_script_redo_proc(Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value local_60;
  Am_Value local_50;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object cmd;
  Am_Value_List cmd_list;
  Am_Object *execute_command_local;
  
  pAVar2 = Am_Object::Get(execute_command,Am_COMMANDS_IN_SCRIPT,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&cmd,pAVar2);
  Am_Object::Am_Object(&local_28);
  Am_Value_List::Start((Am_Value_List *)&cmd);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)&cmd);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)&cmd);
    Am_Object::operator=(&local_28,pAVar2);
    Am_Value::Am_Value(&local_50,&Am_No_Value);
    Am_Value::Am_Value(&local_60,&Am_No_Value);
    am_perform_on_cmd_and_impls
              (local_40,(Am_Slot_Key)&local_28,true,(Am_Value *)0x0,&local_50,SUB81(&local_60,0));
    Am_Object::~Am_Object(local_40);
    Am_Value::~Am_Value(&local_60);
    Am_Value::~Am_Value(&local_50);
    Am_Value_List::Next((Am_Value_List *)&cmd);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&cmd);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, execute_script_redo,
                 (Am_Object execute_command))
{
  Am_Value_List cmd_list = execute_command.Get(Am_COMMANDS_IN_SCRIPT);
  Am_Object cmd;
  //go forwards when redoing
  for (cmd_list.Start(); !cmd_list.Last(); cmd_list.Next()) {
    cmd = cmd_list.Get();
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Undoing command " << cmd);
    am_perform_on_cmd_and_impls(cmd, Am_REDO_METHOD);
  }
}